

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O3

bool __thiscall
stream::inno_lzma2_decompressor_impl::filter
          (inno_lzma2_decompressor_impl *this,char **begin_in,char *end_in,char **begin_out,
          char *end_out,bool flush)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  lzma_stream *plVar4;
  string *psVar5;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  lzma_options_lzma local_a0;
  
  if ((this->super_lzma_decompressor_impl_base).stream == (void *)0x0) {
    pbVar2 = (byte *)*begin_in;
    if (pbVar2 == (byte *)end_in) {
      return true;
    }
    *begin_in = (char *)(pbVar2 + 1);
    bVar1 = *pbVar2;
    if (0x28 < bVar1) {
      psVar5 = (string *)__cxa_allocate_exception(0x28);
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char*>((string *)local_c0,"inno lzma2 property error","");
      std::ios_base::failure[abi:cxx11]::failure(psVar5);
      *(undefined ***)psVar5 = &PTR__failure_00172700;
      *(undefined4 *)(psVar5 + 0x20) = 7;
      __cxa_throw(psVar5,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
    local_a0.dict_size = 0xffffffff;
    if (bVar1 != 0x28) {
      local_a0.dict_size = (bVar1 & 1 | 2) << ((bVar1 >> 1) + 0xb & 0x1f);
    }
    plVar4 = init_raw_lzma_stream(0x21,&local_a0);
    (this->super_lzma_decompressor_impl_base).stream = plVar4;
  }
  bVar3 = lzma_decompressor_impl_base::filter
                    (&this->super_lzma_decompressor_impl_base,begin_in,end_in,begin_out,end_out,
                     flush);
  return bVar3;
}

Assistant:

bool inno_lzma2_decompressor_impl::filter(const char * & begin_in, const char * end_in,
                                          char * & begin_out, char * end_out, bool flush) {
	
	// Decode the header.
	if(!stream) {
		
		if(begin_in == end_in) {
			return true;
		}
		
		lzma_options_lzma options;
		
		boost::uint8_t prop = boost::uint8_t(*begin_in++);
		if(prop > 40) {
			throw lzma_error("inno lzma2 property error", LZMA_FORMAT_ERROR);
		}
		
		if(prop == 40) {
			options.dict_size = 0xffffffff;
		} else {
			options.dict_size = ((boost::uint32_t(2) | boost::uint32_t((prop) & 1)) << ((prop) / 2 + 11));
		}
		
		stream = init_raw_lzma_stream(LZMA_FILTER_LZMA2, options);
	}
	
	return lzma_decompressor_impl_base::filter(begin_in, end_in, begin_out, end_out, flush);
}